

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<short,short,duckdb::GreaterThanEquals,false,false,true,true>
                (short *ldata,short *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  short sVar1;
  short sVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  sel_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (count + 0x3f < 0x40) {
    iVar8 = 0;
  }
  else {
    puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar8 = 0;
    lVar11 = 0;
    uVar14 = 0;
    uVar15 = 0;
    do {
      uVar13 = uVar14;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar16 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar16 = count;
        }
LAB_01492e7a:
        if (uVar14 < uVar16) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          do {
            uVar13 = uVar14;
            if (psVar5 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar5[uVar14];
            }
            sVar1 = rdata[uVar14];
            sVar2 = ldata[uVar14];
            psVar6[iVar8] = (sel_t)uVar13;
            iVar8 = iVar8 + (sVar1 <= sVar2);
            psVar7[lVar11] = (sel_t)uVar13;
            lVar11 = lVar11 + (ulong)(sVar2 < sVar1);
            uVar14 = uVar14 + 1;
            uVar13 = uVar16;
          } while (uVar16 != uVar14);
        }
      }
      else {
        uVar4 = puVar3[uVar15];
        uVar16 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar16 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_01492e7a;
        if (uVar4 == 0) {
          uVar13 = uVar16;
          if (uVar14 < uVar16) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              sVar12 = (sel_t)uVar14;
              if (psVar5 != (sel_t *)0x0) {
                sVar12 = psVar5[uVar14];
              }
              psVar6[lVar11] = sVar12;
              lVar11 = lVar11 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
          }
        }
        else if (uVar14 < uVar16) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          uVar9 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              sVar12 = (int)uVar14 + (int)uVar9;
            }
            else {
              sVar12 = psVar5[uVar14 + uVar9];
            }
            if ((uVar4 >> (uVar9 & 0x3f) & 1) == 0) {
              bVar10 = false;
            }
            else {
              bVar10 = rdata[uVar14 + uVar9] <= ldata[uVar14 + uVar9];
            }
            psVar6[iVar8] = sVar12;
            iVar8 = iVar8 + bVar10;
            psVar7[lVar11] = sVar12;
            lVar11 = lVar11 + (ulong)(bVar10 ^ 1);
            uVar9 = uVar9 + 1;
            uVar13 = uVar16;
          } while (uVar16 - uVar14 != uVar9);
        }
      }
      uVar14 = uVar13;
      uVar15 = uVar15 + 1;
    } while (uVar15 != count + 0x3f >> 6);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}